

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transforms.c
# Opt level: O2

mat4_t * mat4_ortho2(mat4_t *__return_storage_ptr__,vec2_t lb,vec2_t rt)

{
  vec3_t lbn;
  vec3_t rtf;
  
  lbn.z = -1.0;
  lbn._0_8_ = lb;
  rtf.z = 1.0;
  rtf._0_8_ = rt;
  mat4_ortho3(__return_storage_ptr__,lbn,rtf);
  return __return_storage_ptr__;
}

Assistant:

mat4_t
mat4_ortho2(vec2_t lb, vec2_t rt) {
    vec3_t	vl	= vec3(lb.x, lb.y, -1.0f);
    vec3_t	vr	= vec3(rt.x, rt.y,  1.0f);
    return mat4_ortho3(vl, vr);
}